

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryMappedFile.cpp
# Opt level: O1

ptr_t __thiscall
aeron::util::MemoryMappedFile::mapExisting
          (MemoryMappedFile *this,char *filename,off_t offset,size_t length)

{
  FileHandle fd_00;
  long *plVar1;
  MemoryMappedFile *this_00;
  SourcedException *this_01;
  char *pcVar2;
  size_type *psVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  ptr_t pVar4;
  FileHandle fd;
  allocator local_b5;
  int local_b4;
  string local_b0;
  string local_90;
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  string local_50;
  
  fd_00.handle = open64(filename,2,0x1b6);
  local_b4 = fd_00.handle;
  if (-1 < fd_00.handle) {
    plVar1 = (long *)operator_new(0x10);
    *plVar1 = (long)&PTR__FuncHolder_00164bc0;
    plVar1[1] = (long)&local_b4;
    this_00 = (MemoryMappedFile *)operator_new(0x10);
    MemoryMappedFile(this_00,fd_00,offset,length);
    this->m_memory = (uint8_t *)this_00;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<aeron::util::MemoryMappedFile*>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&this->m_memorySize,this_00);
    (**(code **)(*plVar1 + 8))(plVar1);
    pVar4.super___shared_ptr<aeron::util::MemoryMappedFile,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = extraout_RDX._M_pi;
    pVar4.super___shared_ptr<aeron::util::MemoryMappedFile,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         this;
    return (ptr_t)pVar4.
                  super___shared_ptr<aeron::util::MemoryMappedFile,_(__gnu_cxx::_Lock_policy)2>;
  }
  this_01 = (SourcedException *)__cxa_allocate_exception(0x48);
  local_70[0] = local_60;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_70,"failed to open existing file: ","");
  plVar1 = (long *)std::__cxx11::string::append((char *)local_70);
  local_b0._M_dataplus._M_p = (pointer)*plVar1;
  psVar3 = (size_type *)(plVar1 + 2);
  if ((size_type *)local_b0._M_dataplus._M_p == psVar3) {
    local_b0.field_2._M_allocated_capacity = *psVar3;
    local_b0.field_2._8_4_ = (undefined4)plVar1[3];
    local_b0.field_2._12_4_ = *(undefined4 *)((long)plVar1 + 0x1c);
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  }
  else {
    local_b0.field_2._M_allocated_capacity = *psVar3;
  }
  local_b0._M_string_length = plVar1[1];
  *plVar1 = (long)psVar3;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_90,
             "static MemoryMappedFile::ptr_t aeron::util::MemoryMappedFile::mapExisting(const char *, off_t, size_t)"
             ,"");
  pcVar2 = past_prefix("/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client"
                       ,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/build_O1/deps/aeron/src/aeron_project/aeron-client/src/main/cpp/util/MemoryMappedFile.cpp"
                      );
  std::__cxx11::string::string((string *)&local_50,pcVar2,&local_b5);
  SourcedException::SourcedException(this_01,&local_b0,&local_90,&local_50,0x96);
  *(undefined ***)this_01 = &PTR__SourcedException_00164b60;
  __cxa_throw(this_01,&IOException::typeinfo,SourcedException::~SourcedException);
}

Assistant:

MemoryMappedFile::ptr_t MemoryMappedFile::mapExisting(const char *filename, off_t offset, size_t length)
{
    FileHandle fd;
    fd.handle = ::open(filename, O_RDWR, 0666);

    if (fd.handle < 0)
    {
        throw IOException(std::string("failed to open existing file: ") + filename, SOURCEINFO);
    }

    OnScopeExit tidy([&]()
    {
        close(fd.handle);
    });

    return MemoryMappedFile::ptr_t(new MemoryMappedFile(fd, offset, length));
}